

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

acmod_id_t acmod_set_enum(void)

{
  undefined4 local_c;
  cell_index_t ret;
  
  local_c = itree_enum();
  if (local_c == 0xffffffff) {
    local_c = 0xffffffff;
  }
  return local_c;
}

Assistant:

acmod_id_t
acmod_set_enum()
{
    cell_index_t ret;

    ret = itree_enum();

    if (ret != NULL_INDEX) {
	return ret;
    }
    else {
	return NO_ACMOD;
    }
}